

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<char,_true,_5> __thiscall
immutable::vector<char,_true,_5>::take(vector<char,_true,_5> *this,size_type_conflict elems)

{
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  ref<immutable::rrb<char,_true,_5>_> local_20;
  ref<immutable::rrb<char,_true,_5>_> local_18;
  vector<char,_true,_5> local_10;
  
  local_20.ptr = *(rrb<char,_true,_5> **)CONCAT44(in_register_00000034,elems);
  if (local_20.ptr != (rrb<char,_true,_5> *)0x0) {
    LOCK();
    ((local_20.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i =
         ((local_20.ptr)->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  rrb_details::rrb_drop_right<char,true,5>((rrb_details *)&local_18,&local_20,in_EDX);
  rrb_details::rrb_drop_left<char,true,5>((rrb_details *)&local_10,&local_18,0);
  ref<immutable::rrb<char,_true,_5>_>::~ref(&local_18);
  ref<immutable::rrb<char,_true,_5>_>::~ref(&local_20);
  (this->_impl).ptr = (rrb<char,_true,_5> *)local_10;
  if (local_10._impl.ptr != (rrb<char,_true,_5> *)0x0) {
    LOCK();
    (((atomic<unsigned_int> *)((long)local_10._impl.ptr + 0x20))->super___atomic_base<unsigned_int>)
    ._M_i = (((atomic<unsigned_int> *)((long)local_10._impl.ptr + 0x20))->
            super___atomic_base<unsigned_int>)._M_i + 1;
    UNLOCK();
  }
  ref<immutable::rrb<char,_true,_5>_>::~ref(&local_10._impl);
  return (vector<char,_true,_5>)(ref<immutable::rrb<char,_true,_5>_>)this;
}

Assistant:

vector take(size_type elems) const
        {       
        return rrb_slice(_impl, 0, elems);
        }